

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

double duckdb::LnOperator::Operation<double,double>(double input)

{
  OutOfRangeException *pOVar1;
  double dVar2;
  allocator local_39;
  string local_38;
  
  if (input < 0.0) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"cannot take logarithm of a negative number",&local_39);
    OutOfRangeException::OutOfRangeException(pOVar1,&local_38);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((input == 0.0) && (!NAN(input))) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"cannot take logarithm of zero",&local_39);
    OutOfRangeException::OutOfRangeException(pOVar1,&local_38);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  dVar2 = log(input);
  return dVar2;
}

Assistant:

static inline TR Operation(TA input) {
		if (input < 0) {
			throw OutOfRangeException("cannot take logarithm of a negative number");
		}
		if (input == 0) {
			throw OutOfRangeException("cannot take logarithm of zero");
		}
		return std::log(input);
	}